

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::SeekToRestartPoint(Iter *this,uint32_t index)

{
  long lVar1;
  uint32_t uVar2;
  undefined4 in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  uint32_t offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            (in_stack_ffffffffffffffc8);
  *(undefined4 *)(in_RDI + 0x44) = in_ESI;
  uVar2 = GetRestartPoint((Iter *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),
                          (uint32_t)((ulong)in_RDI >> 0x20));
  Slice::Slice((Slice *)CONCAT44(in_ESI,uVar2),in_RDI,(size_t)in_stack_ffffffffffffffc8);
  *(undefined4 *)(in_RDI + 0x68) = local_18;
  *(undefined4 *)(in_RDI + 0x6c) = uStack_14;
  *(undefined4 *)(in_RDI + 0x70) = uStack_10;
  *(undefined4 *)(in_RDI + 0x74) = uStack_c;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeekToRestartPoint(uint32_t index) {
    key_.clear();
    restart_index_ = index;
    // current_ will be fixed by ParseNextKey();

    // ParseNextKey() starts at the end of value_, so set value_ accordingly
    uint32_t offset = GetRestartPoint(index);
    value_ = Slice(data_ + offset, 0);
  }